

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar-memory-write-test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  size_t __n;
  char *__s;
  mtar_t tar;
  mtar_t local_80;
  
  if (argc < 2) {
    puts("error: no argument");
    return 1;
  }
  __stream = fopen(argv[1],"rb");
  if (__stream == (FILE *)0x0) {
    __s = "error: unable to open";
  }
  else {
    __n = fread(main::buf,1,4000,__stream);
    if (__n == 0) {
      puts("error: unable to read");
      fclose(__stream);
      return 7;
    }
    fclose(__stream);
    uVar1 = mtar_open_memory(&local_80,(void *)0x0,0);
    if (uVar1 != 0) {
      printf("error: %d\n",(ulong)uVar1);
      return 2;
    }
    mtar_write_file_header(&local_80,"test1.txt",0xb);
    mtar_write_data(&local_80,"Hello world",0xb);
    mtar_write_file_header(&local_80,"test2.txt",0xd);
    mtar_write_data(&local_80,"Goodbye world",0xd);
    uVar1 = mtar_finalize(&local_80);
    if (uVar1 != 0) {
      printf("error: %d\n",(ulong)uVar1);
      return 3;
    }
    if (__n != local_80.memory_size) {
      puts("size differs");
      return 5;
    }
    iVar2 = bcmp(main::buf,local_80.memory,__n);
    if (iVar2 == 0) {
      uVar1 = mtar_close(&local_80);
      if (uVar1 == 0) {
        puts("success");
        return 0;
      }
      printf("error: %d\n",(ulong)uVar1);
      return 4;
    }
    __s = "data differs";
  }
  puts(__s);
  return 6;
}

Assistant:

int main(int argc, char **argv)
{
    mtar_t tar;
    const char *str1 = "Hello world";
    const char *str2 = "Goodbye world";

    if (argc < 2)
    {
        printf("error: no argument\n");
        return 1;
    }

    FILE *fp = fopen(argv[1], "rb");
    if (!fp)
    {
        printf("error: unable to open\n");
        return 6;
    }

    static char buf[4000];
    size_t size = fread(buf, 1, 4000, fp);
    if (!size)
    {
        printf("error: unable to read\n");
        fclose(fp);
        return 7;
    }
    fclose(fp);

    if (int error = mtar_open_memory(&tar, NULL, 0))
    {
        printf("error: %d\n", error);
        return 2;
    }

    mtar_write_file_header(&tar, "test1.txt", strlen(str1));
    mtar_write_data(&tar, str1, strlen(str1));
    mtar_write_file_header(&tar, "test2.txt", strlen(str2));
    mtar_write_data(&tar, str2, strlen(str2));

    if (int error = mtar_finalize(&tar))
    {
        printf("error: %d\n", error);
        return 3;
    }

    if (size != tar.memory_size)
    {
        printf("size differs\n");
        return 5;
    }

    if (memcmp(buf, tar.memory, size) != 0)
    {
        printf("data differs\n");
        return 6;
    }

    if (int error = mtar_close(&tar))
    {
        printf("error: %d\n", error);
        return 4;
    }

    puts("success");
    return 0;
}